

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O2

bool __thiscall RTIMUMPU9250::IMURead(RTIMUMPU9250 *this)

{
  RTIMU_DATA *pRVar1;
  int *piVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint64_t uVar7;
  int iVar8;
  uchar fifoCount [2];
  uchar fifoData [12];
  uchar compassData [8];
  
  bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'r',
                            '\x02',fifoCount,"Failed to read fifo count");
  if (!bVar3) goto LAB_0011a799;
  uVar4 = (short)fifoCount << 8 | (ushort)fifoCount >> 8;
  if (uVar4 == 0x200) {
    iVar5 = 0;
    printf("%s","MPU-9250 fifo has overflowed");
    fflush(_stdout);
    resetFifo(this);
    pRVar1 = &(this->super_RTIMU).m_imuData;
    pRVar1->timestamp = pRVar1->timestamp + (this->super_RTIMU).m_sampleInterval * 0x2b;
    goto LAB_0011a79b;
  }
  iVar6 = this->m_cacheCount;
  if (uVar4 - 0xc < 0xb4 && iVar6 == 0) {
    bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                              't','\f',fifoData,"Failed to read fifo data");
    if ((bVar3) &&
       (bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_slaveAddr,'I','\b',compassData,
                                  "Failed to read compass data"), bVar3)) {
LAB_0011a6d1:
      RTMath::convertToVector(fifoData,&(this->super_RTIMU).m_imuData.accel,this->m_accelScale,true)
      ;
      RTMath::convertToVector
                (fifoData + 6,&(this->super_RTIMU).m_imuData.gyro,this->m_gyroScale,true);
      RTMath::convertToVector(compassData + 1,&(this->super_RTIMU).m_imuData.compass,0.6,false);
      *(ulong *)((this->super_RTIMU).m_imuData.gyro.m_data + 1) =
           *(ulong *)((this->super_RTIMU).m_imuData.gyro.m_data + 1) ^ 0x8000000080000000;
      (this->super_RTIMU).m_imuData.accel.m_data[0] = -(this->super_RTIMU).m_imuData.accel.m_data[0]
      ;
      (this->super_RTIMU).m_imuData.compass.m_data[2] =
           (this->super_RTIMU).m_imuData.compass.m_data[2] * this->m_compassAdjust[2];
      *(ulong *)(this->super_RTIMU).m_imuData.compass.m_data =
           CONCAT44((float)*(undefined8 *)this->m_compassAdjust *
                    -(this->super_RTIMU).m_imuData.compass.m_data[0],
                    (float)((ulong)*(undefined8 *)this->m_compassAdjust >> 0x20) *
                    (this->super_RTIMU).m_imuData.compass.m_data[1]);
      RTIMU::handleGyroBias(&this->super_RTIMU);
      RTIMU::calibrateAverageCompass(&this->super_RTIMU);
      RTIMU::calibrateAccel(&this->super_RTIMU);
      if (this->m_firstTime == true) {
        uVar7 = RTMath::currentUSecsSinceEpoch();
      }
      else {
        uVar7 = (this->super_RTIMU).m_imuData.timestamp + (this->super_RTIMU).m_sampleInterval;
      }
      (this->super_RTIMU).m_imuData.timestamp = uVar7;
      this->m_firstTime = false;
      RTIMU::updateFusion(&this->super_RTIMU);
      iVar5 = 1;
      goto LAB_0011a79b;
    }
  }
  else {
    if (0xbf < uVar4) {
      if (iVar6 == 0x10) {
        iVar5 = this->m_cacheOut;
        pRVar1 = &(this->super_RTIMU).m_imuData;
        pRVar1->timestamp =
             pRVar1->timestamp +
             (long)this->m_cache[iVar5].count * (this->super_RTIMU).m_sampleInterval;
        iVar5 = iVar5 + 1;
        iVar6 = 0;
        if (iVar5 != 0x10) {
          iVar6 = iVar5;
        }
        this->m_cacheOut = iVar6;
        this->m_cacheCount = 0xf;
      }
      bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                                't',0xc0,this->m_cache[this->m_cacheIn].data,
                                "Failed to read fifo data");
      if (!bVar3) goto LAB_0011a799;
      bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                                'I','\b',this->m_cache[this->m_cacheIn].compass,
                                "Failed to read compass data");
      iVar5 = 0;
      if (!bVar3) goto LAB_0011a79b;
      iVar8 = this->m_cacheIn;
      this->m_cache[iVar8].count = 0x10;
      this->m_cache[iVar8].index = 0;
      iVar6 = this->m_cacheCount + 1;
      this->m_cacheCount = iVar6;
      iVar8 = iVar8 + 1;
      if (iVar8 != 0x10) {
        iVar5 = iVar8;
      }
      this->m_cacheIn = iVar5;
    }
    if (iVar6 != 0) {
      iVar5 = this->m_cacheOut;
      iVar8 = this->m_cache[iVar5].index;
      fifoData._8_4_ = *(undefined4 *)(this->m_cache[iVar5].data + (long)iVar8 + 8);
      fifoData._0_8_ = *(undefined8 *)(this->m_cache[iVar5].data + iVar8);
      compassData = *&this->m_cache[iVar5].compass;
      this->m_cache[iVar5].index = iVar8 + 0xc;
      piVar2 = &this->m_cache[iVar5].count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        iVar8 = 0;
        if (iVar5 + 1 != 0x10) {
          iVar8 = iVar5 + 1;
        }
        this->m_cacheOut = iVar8;
        this->m_cacheCount = iVar6 + -1;
      }
      goto LAB_0011a6d1;
    }
  }
LAB_0011a799:
  iVar5 = 0;
LAB_0011a79b:
  return SUB41(iVar5,0);
}

Assistant:

bool RTIMUMPU9250::IMURead()
{
    unsigned char fifoCount[2];
    unsigned int count;
    unsigned char fifoData[12];
    unsigned char compassData[8];

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_COUNT_H, 2, fifoCount, "Failed to read fifo count"))
         return false;

    count = ((unsigned int)fifoCount[0] << 8) + fifoCount[1];

    if (count == 512) {
        HAL_INFO("MPU-9250 fifo has overflowed");
        resetFifo();
        m_imuData.timestamp += m_sampleInterval * (512 / MPU9250_FIFO_CHUNK_SIZE + 1); // try to fix timestamp
        return false;
    }

#ifdef MPU9250_CACHE_MODE
    if ((m_cacheCount == 0) && (count  >= MPU9250_FIFO_CHUNK_SIZE) && (count < (MPU9250_CACHE_SIZE * MPU9250_FIFO_CHUNK_SIZE))) {
        // special case of a small fifo and nothing cached - just handle as simple read

        if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
            return false;

        if (!m_settings->HALRead(m_slaveAddr, MPU9250_EXT_SENS_DATA_00, 8, compassData, "Failed to read compass data"))
            return false;
    } else {
        if (count >= (MPU9250_CACHE_SIZE * MPU9250_FIFO_CHUNK_SIZE)) {
            if (m_cacheCount == MPU9250_CACHE_BLOCK_COUNT) {
                // all cache blocks are full - discard oldest and update timestamp to account for lost samples
                m_imuData.timestamp += m_sampleInterval * m_cache[m_cacheOut].count;
                if (++m_cacheOut == MPU9250_CACHE_BLOCK_COUNT)
                    m_cacheOut = 0;
                m_cacheCount--;
            }

            int blockCount = count / MPU9250_FIFO_CHUNK_SIZE;   // number of chunks in fifo

            if (blockCount > MPU9250_CACHE_SIZE)
                blockCount = MPU9250_CACHE_SIZE;

            if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE * blockCount,
                    m_cache[m_cacheIn].data, "Failed to read fifo data"))
                return false;

            if (!m_settings->HALRead(m_slaveAddr, MPU9250_EXT_SENS_DATA_00, 8, m_cache[m_cacheIn].compass, "Failed to read compass data"))
                return false;

            m_cache[m_cacheIn].count = blockCount;
            m_cache[m_cacheIn].index = 0;

            m_cacheCount++;
            if (++m_cacheIn == MPU9250_CACHE_BLOCK_COUNT)
                m_cacheIn = 0;

        }

        //  now fifo has been read if necessary, get something to process

        if (m_cacheCount == 0)
            return false;

        memcpy(fifoData, m_cache[m_cacheOut].data + m_cache[m_cacheOut].index, MPU9250_FIFO_CHUNK_SIZE);
        memcpy(compassData, m_cache[m_cacheOut].compass, 8);

        m_cache[m_cacheOut].index += MPU9250_FIFO_CHUNK_SIZE;

        if (--m_cache[m_cacheOut].count == 0) {
            //  this cache block is now empty

            if (++m_cacheOut == MPU9250_CACHE_BLOCK_COUNT)
                m_cacheOut = 0;
            m_cacheCount--;
        }
    }

#else

    if (count > MPU9250_FIFO_CHUNK_SIZE * 40) {
        // more than 40 samples behind - going too slowly so discard some samples but maintain timestamp correctly
        while (count >= MPU9250_FIFO_CHUNK_SIZE * 10) {
            if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
                return false;
            count -= MPU9250_FIFO_CHUNK_SIZE;
            m_imuData.timestamp += m_sampleInterval;
        }
    }

    if (count < MPU9250_FIFO_CHUNK_SIZE)
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_EXT_SENS_DATA_00, 8, compassData, "Failed to read compass data"))
        return false;

#endif

    RTMath::convertToVector(fifoData, m_imuData.accel, m_accelScale, true);
    RTMath::convertToVector(fifoData + 6, m_imuData.gyro, m_gyroScale, true);
    RTMath::convertToVector(compassData + 1, m_imuData.compass, 0.6f, false);

    //  sort out gyro axes

    m_imuData.gyro.setX(m_imuData.gyro.x());
    m_imuData.gyro.setY(-m_imuData.gyro.y());
    m_imuData.gyro.setZ(-m_imuData.gyro.z());

    //  sort out accel data;

    m_imuData.accel.setX(-m_imuData.accel.x());

    //  use the compass fuse data adjustments

    m_imuData.compass.setX(m_imuData.compass.x() * m_compassAdjust[0]);
    m_imuData.compass.setY(m_imuData.compass.y() * m_compassAdjust[1]);
    m_imuData.compass.setZ(m_imuData.compass.z() * m_compassAdjust[2]);

    //  sort out compass axes

    float temp;

    temp = m_imuData.compass.x();
    m_imuData.compass.setX(m_imuData.compass.y());
    m_imuData.compass.setY(-temp);

    //  now do standard processing

    handleGyroBias();
    calibrateAverageCompass();
    calibrateAccel();

    if (m_firstTime)
        m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
    else
        m_imuData.timestamp += m_sampleInterval;

    m_firstTime = false;

    //  now update the filter

    updateFusion();

    return true;
}